

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::
verifyResultImageAndSetResult(MultisampleRenderCase *this,Surface *resultImage)

{
  int iVar1;
  
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])();
  if ((char)iVar1 == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  return;
}

Assistant:

void MultisampleRenderCase::verifyResultImageAndSetResult (const tcu::Surface& resultImage)
{
	// verify using case-specific verification

	try
	{
		if (!verifyImage(resultImage))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}
	catch (const QualityWarning& ex)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Quality warning, error = " << ex.what() << tcu::TestLog::EndMessage;

		// Failures are more important than warnings
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, ex.what());
	}
}